

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O0

buffer_ptr_t __thiscall rudp::session::generate_ack(session *this)

{
  static_vector<unsigned_char,_2048UL,_void> *this_00;
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  *pvVar1;
  reference puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer_ptr_t bVar3;
  session *this_local;
  buffer_ptr_t *buffer;
  
  this_00 = (static_vector<unsigned_char,_2048UL,_void> *)operator_new(0x808);
  boost::container::static_vector<unsigned_char,_2048UL,_void>::static_vector(this_00,6);
  std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>::
  shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>,void>
            ((shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>> *)this,this_00)
  ;
  pvVar1 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  puVar2 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](pvVar1,0);
  *puVar2 = '@';
  pvVar1 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  puVar2 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](pvVar1,1);
  *puVar2 = '\x06';
  bVar3.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  bVar3.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (buffer_ptr_t)
         bVar3.
         super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

buffer_ptr_t session::generate_ack() {
    buffer_ptr_t buffer( new buffer_t( 6 ) );
    (*buffer)[ 0 ] = 0x40;
    (*buffer)[ 1 ] = 6;
    return buffer;
  }